

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav * drwav_open_file(char *filename)

{
  FILE *__stream;
  drwav *pdVar1;
  
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    pdVar1 = drwav_open(drwav__on_read_stdio,drwav__on_seek_stdio,__stream);
    if (pdVar1 != (drwav *)0x0) {
      return pdVar1;
    }
    fclose(__stream);
  }
  return (drwav *)0x0;
}

Assistant:

drwav* drwav_open_file(const char* filename) {
    FILE* pFile;
#if defined(_MSC_VER) && _MSC_VER >= 1400
    if (fopen_s(&pFile, filename, "rb") != 0) {
        return NULL;
    }
#else
    pFile = fopen(filename, "rb");
    if (pFile == NULL) {
        return NULL;
    }
#endif

    drwav* pWav = drwav_open(drwav__on_read_stdio, drwav__on_seek_stdio, (void*)pFile);
    if (pWav == NULL) {
        fclose(pFile);
        return NULL;
    }

    return pWav;
}